

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O3

void __thiscall onmt::Tokenizer::Options::validate(Options *this)

{
  pointer pbVar1;
  bool bVar2;
  size_t sVar3;
  invalid_argument *piVar4;
  pointer alphabet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->joiner)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->joiner);
  }
  if (this->case_markup == true) {
    if (this->mode - Space < 2) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,
                 "case_markup also enables segment_case which is not compatible with \'none\' and \'space\' tokenization modes"
                );
      goto LAB_001b20af;
    }
    this->segment_case = true;
    if (this->case_feature == true) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,"case_feature and case_markup can\'t be set at the same time");
      goto LAB_001b20af;
    }
  }
  if ((this->joiner_annotate == true) && (this->spacer_annotate == true)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,"joiner_annotate and spacer_annotate can\'t be set at the same time");
  }
  else if ((this->spacer_new == true) && (this->spacer_annotate == false)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"spacer_new requires spacer_annotate");
  }
  else if ((this->joiner_annotate == false) && (this->joiner_new != false)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"joiner_new requires joiner_annotate");
  }
  else {
    if (this->support_prior_joiners == true) {
      sVar3 = unicode::utf8len(&this->joiner);
      if (sVar3 != 1) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar4,"support_prior_joiners does not support multi-character joiners");
        goto LAB_001b20af;
      }
    }
    if ((this->with_separators != true) ||
       ((this->spacer_annotate == false && (this->joiner_annotate != true)))) {
      pbVar1 = (this->segment_alphabet).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (alphabet = (this->segment_alphabet).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; alphabet != pbVar1;
          alphabet = alphabet + 1) {
        bVar2 = add_alphabet_to_segment(this,alphabet);
        if (!bVar2) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_40,"invalid Unicode script in segment_alphabet list: ",alphabet);
          std::invalid_argument::invalid_argument(piVar4,(string *)&local_40);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      if ((this->lang)._M_string_length != 0) {
        bVar2 = unicode::support_language_rules();
        if (!bVar2) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar4,"this build does not support language-specific rules");
          goto LAB_001b20af;
        }
        bVar2 = unicode::is_valid_language((this->lang)._M_dataplus._M_p);
        if (!bVar2) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_40,"lang is not a valid ISO language code: ",&this->lang);
          std::invalid_argument::invalid_argument(piVar4,(string *)&local_40);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      return;
    }
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,
               "spacer_annotate or joiner_annotate should not be used when with_separators is enabled since the output is already reversible"
              );
  }
LAB_001b20af:
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Tokenizer::Options::validate()
  {
    // Set default options.
    if (joiner.empty())
      joiner = joiner_marker;
    if (case_markup)
    {
      if (mode == Tokenizer::Mode::None || mode == Tokenizer::Mode::Space)
        throw std::invalid_argument("case_markup also enables segment_case which is not "
                                    "compatible with 'none' and 'space' tokenization modes");
      segment_case = true;
    }

    // Check options consistency.
    if (case_feature && case_markup)
      throw std::invalid_argument("case_feature and case_markup can't be set at the same time");
    if (joiner_annotate && spacer_annotate)
      throw std::invalid_argument("joiner_annotate and spacer_annotate can't be set at the same time");
    if (spacer_new && !spacer_annotate)
      throw std::invalid_argument("spacer_new requires spacer_annotate");
    if (joiner_new && !joiner_annotate)
      throw std::invalid_argument("joiner_new requires joiner_annotate");
    if (support_prior_joiners && unicode::utf8len(joiner) != 1)
      throw std::invalid_argument("support_prior_joiners does not support multi-character joiners");
    if (with_separators && (spacer_annotate || joiner_annotate))
      throw std::invalid_argument("spacer_annotate or joiner_annotate should not be used when "
                                  "with_separators is enabled since the output is already "
                                  "reversible");

    for (const std::string& alphabet : segment_alphabet)
    {
      if (!add_alphabet_to_segment(alphabet))
        throw std::invalid_argument("invalid Unicode script in segment_alphabet list: " + alphabet);
    }

    if (!lang.empty())
    {
      if (!unicode::support_language_rules())
        throw std::invalid_argument("this build does not support language-specific rules");
      if (!unicode::is_valid_language(lang.c_str()))
        throw std::invalid_argument("lang is not a valid ISO language code: " + lang);
    }
  }